

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O3

void __thiscall Enumerated::Encode(Enumerated *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  overflow_error *this_00;
  
  if (2 < cbOut) {
    pOut[0] = '\n';
    pOut[1] = '\x01';
    pOut[2] = this->value;
    *cbUsed = 3;
    DerBase::CheckOutputSize(&this->super_DerBase,3);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"Overflow in Enumerated::Encode");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void Enumerated::Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed)
{
	if (cbOut < 3)
		throw std::overflow_error("Overflow in Enumerated::Encode");

	pOut[0] = static_cast<unsigned char>(DerType::Enumerated);
	pOut[1] = 1;
	pOut[2] = value;
	cbUsed = 3;
    CheckOutputSize(cbUsed);
}